

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void arima_predict(arima_object obj,double *inp,int L,double *xpred,double *amse)

{
  size_t __size;
  uint ip;
  int d;
  int N;
  uint iq;
  double *pdVar1;
  uint uVar2;
  double *C;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  ulong uVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  ip = obj->p;
  d = obj->d;
  N = obj->N;
  iq = obj->q;
  C = (double *)malloc((long)(int)(d + 1U) << 3);
  __size = (long)N * 8;
  W = (double *)malloc(__size);
  resid = (double *)malloc(__size);
  uVar2 = iq + 1;
  if ((int)(iq + 1) <= (int)ip) {
    uVar2 = ip;
  }
  phi = (double *)malloc((long)(int)uVar2 << 3);
  theta = (double *)malloc((long)(int)uVar2 << 3);
  if (d < 1) {
    *C = 1.0;
    dVar6 = obj->mean;
  }
  else {
    deld(d,C);
    uVar3 = 1;
    do {
      C[uVar3] = -C[uVar3];
      uVar3 = uVar3 + 1;
    } while (d + 1U != uVar3);
    dVar6 = 0.0;
  }
  if (0 < N) {
    pdVar1 = obj->res;
    lVar4 = 0;
    do {
      dVar5 = inp[lVar4];
      if (d == 0) {
        dVar5 = dVar5 - dVar6;
      }
      W[lVar4] = dVar5;
      resid[lVar4] = pdVar1[lVar4];
      lVar4 = lVar4 + 1;
    } while (N != lVar4);
  }
  if (0 < (int)uVar2) {
    memset(theta,0,(ulong)uVar2 << 3);
    memset(phi,0,(ulong)uVar2 << 3);
  }
  if (0 < (int)ip) {
    pdVar1 = obj->phi;
    uVar3 = 0;
    do {
      phi[uVar3] = pdVar1[uVar3];
      uVar3 = uVar3 + 1;
    } while (ip != uVar3);
  }
  if (0 < (int)iq) {
    pdVar1 = obj->theta;
    uVar3 = 0;
    do {
      theta[uVar3] = -pdVar1[uVar3];
      uVar3 = uVar3 + 1;
    } while (iq != uVar3);
  }
  forkal(ip,iq,d,phi,theta,C + 1,N,W,resid,L,xpred,amse);
  if (0 < L) {
    uVar3 = 0;
    do {
      xpred[uVar3] = xpred[uVar3] + dVar6;
      uVar3 = uVar3 + 1;
    } while ((uint)L != uVar3);
  }
  free(C);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void arima_predict(arima_object obj,double *inp, int L,double *xpred,double *amse) {
	int d,i,N,ip,iq,ir;
	double *delta,*W,*resid,*phi,*theta;
	double wmean;

	d = obj->d;
	N = obj->N;
	ip = obj->p;
	iq = obj->q;
	delta = (double*)malloc(sizeof(double)* (d + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);

	ir = iq + 1;

	if (ir < ip) {
		ir = ip;
	}

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	if (d > 0) {
		deld(d, delta);
	}
	else {
		*delta = 1.0;
		wmean = obj->mean;
	}
	for (i = 1; i <= d; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0) {
			W[i] -= wmean;
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < ip; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = -1.0 *  obj->theta[i];
	}

	forkal(ip, iq, d, phi, theta, delta+1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
	}

	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}